

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  runtime_error *this;
  text *this_00;
  pointer pbVar15;
  int local_224;
  seed_t local_1c8;
  text val;
  text opt;
  texts in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  text local_130;
  text local_110;
  text local_f0;
  text local_d0;
  text local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  text arg;
  
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar15 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar1 = true;
  local_224 = 1;
  bVar3 = false;
  bVar4 = false;
  bVar6 = false;
  bVar5 = false;
  bVar7 = false;
  bVar9 = false;
  bVar10 = false;
  bVar13 = false;
  bVar14 = false;
  bVar11 = false;
  bVar12 = false;
  local_1c8 = 0;
  bVar2 = false;
  do {
    if (pbVar15 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = true;
      if (!bVar9) {
        bVar1 = bVar10;
      }
      (__return_storage_ptr__->first).help = bVar2;
      (__return_storage_ptr__->first).abort = bVar3;
      (__return_storage_ptr__->first).count = bVar4;
      (__return_storage_ptr__->first).list = bVar6;
      (__return_storage_ptr__->first).tags = bVar5;
      (__return_storage_ptr__->first).time = bVar7;
      (__return_storage_ptr__->first).pass = bVar1;
      (__return_storage_ptr__->first).zen = bVar10;
      (__return_storage_ptr__->first).lexical = bVar13;
      (__return_storage_ptr__->first).random = bVar14;
      (__return_storage_ptr__->first).verbose = bVar11;
      (__return_storage_ptr__->first).version = bVar12;
      (__return_storage_ptr__->first).repeat = local_224;
      (__return_storage_ptr__->first).seed = local_1c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->second,&in);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&in);
      return __return_storage_ptr__;
    }
    opt._M_dataplus._M_p = (pointer)&opt.field_2;
    opt._M_string_length = 0;
    opt.field_2._M_local_buf[0] = '\0';
    val._M_dataplus._M_p = (pointer)&val.field_2;
    val._M_string_length = 0;
    val.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&arg,(string *)pbVar15);
    std::__cxx11::string::string((string *)&local_b0,(string *)&arg);
    split_option(&local_90,&local_b0);
    local_150._M_dataplus._M_p = (pointer)&val;
    local_150._M_string_length = (size_type)&opt;
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_150,&local_90);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    if ((bVar1) && (*opt._M_dataplus._M_p == '-')) {
      bVar1 = std::operator==(&opt,"--");
      if (bVar1) goto LAB_00108303;
      bVar1 = std::operator==(&opt,"-h");
      if (bVar1) {
LAB_001082ea:
        bVar1 = true;
        bVar2 = true;
      }
      else {
        bVar1 = std::operator==("--help",&opt);
        if (bVar1) goto LAB_001082ea;
        bVar1 = std::operator==(&opt,"-a");
        if (bVar1) {
LAB_00108355:
          bVar1 = true;
          bVar3 = true;
        }
        else {
          bVar1 = std::operator==("--abort",&opt);
          if (bVar1) goto LAB_00108355;
          bVar1 = std::operator==(&opt,"-c");
          if (bVar1) {
LAB_0010838a:
            bVar1 = true;
            bVar4 = true;
          }
          else {
            bVar1 = std::operator==("--count",&opt);
            if (bVar1) goto LAB_0010838a;
            bVar1 = std::operator==(&opt,"-g");
            if (bVar1) {
LAB_001083c2:
              bVar1 = true;
              bVar5 = true;
            }
            else {
              bVar1 = std::operator==("--list-tags",&opt);
              if (bVar1) goto LAB_001083c2;
              bVar1 = std::operator==(&opt,"-l");
              if (bVar1) {
LAB_001083fa:
                bVar1 = true;
                bVar6 = true;
              }
              else {
                bVar1 = std::operator==("--list-tests",&opt);
                if (bVar1) goto LAB_001083fa;
                bVar1 = std::operator==(&opt,"-t");
                if (bVar1) {
LAB_00108432:
                  bVar1 = true;
                  bVar7 = true;
                }
                else {
                  bVar1 = std::operator==("--time",&opt);
                  if (bVar1) goto LAB_00108432;
                  bVar8 = std::operator==(&opt,"-p");
                  bVar1 = true;
                  if (bVar8) {
LAB_00108467:
                    bVar9 = true;
                  }
                  else {
                    bVar8 = std::operator==("--pass",&opt);
                    if (bVar8) goto LAB_00108467;
                    bVar1 = std::operator==(&opt,"-z");
                    if (bVar1) {
LAB_0010849f:
                      bVar1 = true;
                      bVar10 = true;
                    }
                    else {
                      bVar1 = std::operator==("--pass-zen",&opt);
                      if (bVar1) goto LAB_0010849f;
                      bVar1 = std::operator==(&opt,"-v");
                      if (bVar1) {
LAB_001084d7:
                        bVar1 = true;
                        bVar11 = true;
                      }
                      else {
                        bVar1 = std::operator==("--verbose",&opt);
                        if (bVar1) goto LAB_001084d7;
                        bVar8 = std::operator==("--version",&opt);
                        bVar1 = true;
                        if (bVar8) {
                          bVar12 = true;
                        }
                        else {
                          bVar8 = std::operator==(&opt,"--order");
                          if (bVar8) {
                            bVar8 = std::operator==("declared",&val);
                            if (bVar8) goto LAB_00108306;
                          }
                          bVar8 = std::operator==(&opt,"--order");
                          if (bVar8) {
                            bVar8 = std::operator==("lexical",&val);
                            if (!bVar8) goto LAB_00108562;
                            bVar13 = true;
LAB_00108591:
                            bVar1 = true;
                          }
                          else {
LAB_00108562:
                            bVar8 = std::operator==(&opt,"--order");
                            if (bVar8) {
                              bVar8 = std::operator==("random",&val);
                              if (bVar8) {
                                bVar14 = true;
                                goto LAB_00108591;
                              }
                            }
                            bVar8 = std::operator==(&opt,"--random-seed");
                            if (bVar8) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_d0,"--random-seed",
                                         (allocator<char> *)&local_90);
                              std::__cxx11::string::string((string *)&local_f0,(string *)&val);
                              local_1c8 = seed(&local_d0,&local_f0);
                              std::__cxx11::string::~string((string *)&local_f0);
                              this_00 = &local_d0;
                            }
                            else {
                              bVar8 = std::operator==(&opt,"--repeat");
                              if (!bVar8) {
                                this = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::operator+(&local_150,"unrecognised option \'",&opt);
                                std::operator+(&local_90.first,&local_150,"\' (try option --help)");
                                std::runtime_error::runtime_error(this,(string *)&local_90);
                                __cxa_throw(this,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_110,"--repeat",
                                         (allocator<char> *)&local_90);
                              std::__cxx11::string::string((string *)&local_130,(string *)&val);
                              local_224 = repeat(&local_110,&local_130);
                              std::__cxx11::string::~string((string *)&local_130);
                              this_00 = &local_110;
                            }
                            std::__cxx11::string::~string((string *)this_00);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&in,&arg);
LAB_00108303:
      bVar1 = false;
    }
LAB_00108306:
    std::__cxx11::string::~string((string *)&arg);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&opt);
    pbVar15 = pbVar15 + 1;
  } while( true );
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}